

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

bool __thiscall CaptureSummary::AddLine(CaptureSummary *this,CaptureLine *line,bool need_allocation)

{
  pointer *ppp_Var1;
  iterator __position;
  undefined7 in_register_00000011;
  CaptureLine *new_line;
  _capture_line *local_18;
  
  local_18 = line;
  if ((int)CONCAT71(in_register_00000011,need_allocation) != 0) {
    local_18 = (_capture_line *)operator_new(0xd0);
    memcpy(local_18,line,0xd0);
  }
  __position._M_current =
       (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<_capture_line*,std::allocator<_capture_line*>>::
    _M_realloc_insert<_capture_line*const&>
              ((vector<_capture_line*,std::allocator<_capture_line*>> *)&this->summary,__position,
               &local_18);
  }
  else {
    *__position._M_current = local_18;
    ppp_Var1 = &(this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *ppp_Var1 = *ppp_Var1 + 1;
  }
  return true;
}

Assistant:

bool CaptureSummary::AddLine(CaptureLine * line, bool need_allocation)
{
    bool ret = true;
    CaptureLine * new_line;

    if (need_allocation)
    {
        new_line = new CaptureLine;

        if (new_line == NULL)
        {
            ret = false;
        }
        else
        {
            memcpy(new_line, line, sizeof(CaptureLine));
        }
    }
    else
    {
        new_line = line;
    }

    if (ret)
    {
        summary.push_back(new_line);
    }

    return ret;
}